

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtIO.c
# Opt level: O3

newtRef NewtFgets(FILE *stream)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  uint32_t len;
  newtRef nVar6;
  char buff [2048];
  char acStack_838 [2046];
  char local_3a;
  
  __s = fgets(acStack_838,0x800,(FILE *)stream);
  if (__s == (char *)0x0) {
    nVar6 = 2;
  }
  else {
    nVar6 = 2;
    do {
      sVar5 = strlen(__s);
      len = (uint32_t)sVar5;
      if (nVar6 == 2) {
        nVar6 = NewtMakeString2(__s,len,false);
        _Var1 = NewtRefIsNIL(nVar6);
        if (_Var1) {
LAB_001071ec:
          nVar6 = NewtThrow0(-0xbc58);
          return nVar6;
        }
      }
      else {
        uVar2 = NewtStringLength(nVar6);
        nVar6 = NewtStrCat2(nVar6,__s,(long)(int)len);
        uVar3 = NewtStringLength(nVar6);
        if (uVar3 < uVar2 + len) goto LAB_001071ec;
      }
      if ((int)len < 0x7ff) {
        return nVar6;
      }
      if (local_3a == '\r') {
        iVar4 = fgetc((FILE *)stream);
        if (iVar4 << 0x18 != 0xa000000) {
          ungetc((iVar4 << 0x18) >> 0x18,(FILE *)stream);
          return nVar6;
        }
      }
      else if (local_3a == '\n') {
        return nVar6;
      }
      __s = fgets(acStack_838,0x800,(FILE *)stream);
    } while (__s != (char *)0x0);
  }
  return nVar6;
}

Assistant:

newtRef NewtFgets(FILE * stream)
{
    newtRefVar  result = kNewtRefNIL;
    char	buff[NEWT_FGETS_BUFFSIZE];
    char *  str;
    char	c;
    int		maxsize;
    int		oldlen;
    int		len;
    
    maxsize = sizeof(buff) - 1;
    
    while ((str = fgets(buff, sizeof(buff), stream)) != NULL)
    {
        len = (int)strlen(str);
        
        if (result == kNewtRefNIL)
        {	// 文字列オブジェクト作成
            result = NewtMakeString2(str, len, false);
            
            if (NewtRefIsNIL(result))
            {	// メモリを確保できなかった
                return NewtThrow0(kNErrOutOfObjectMemory);
            }
        }
        else
        {	// 追加
            oldlen = NewtStringLength(result);
            result = NewtStrCat2(result, str, len);
            
            if (NewtStringLength(result) < oldlen + len)
            {	// メモリを確保できなかった
                return NewtThrow0(kNErrOutOfObjectMemory);
            }
        }
        
        if (len < maxsize)
            break;
        
        // 最後の文字をチェック
        c = buff[maxsize - 1];
        
        if (c == '\n')
            break;
        
        if (c == '\r')
        {
            // １文字先読み
            c = fgetc(stream);
            
            if (c != '\n')
            {	// CRLF でない（CR のみ）場合
                // 先読みした文字をストリームに戻す
                ungetc(c, stream);
                break;
            }
        }
    }
    
    return result;
}